

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

MPP_RET read_image(RK_U8 *buf,FILE *fp,RK_U32 width,RK_U32 height,RK_U32 hor_stride,
                  RK_U32 ver_stride,MppFrameFormat fmt)

{
  MppFrameFormat MVar1;
  MPP_RET MVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  RK_S32 pix_w;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  if ((fmt & 0xf00000) != MPP_FMT_YUV420SP) {
    uVar10 = (height + 0xf & 0xfffffff0) * (width + 0xf & 0xfffffff0);
    uVar9 = (uVar10 >> 4) + 0xfff & 0x1ffff000;
    if ((fmt & 0xf00000) != 0x100000) {
      uVar9 = uVar10 >> 4;
    }
    sVar4 = fread(buf,1,(ulong)uVar9,(FILE *)fp);
    if (uVar9 != (uint)sVar4) {
      pcVar5 = "read fbc file header failed %d vs %d\n";
      uVar7 = sVar4 & 0xffffffff;
      uVar8 = (ulong)uVar9;
      goto LAB_001044e8;
    }
    MVar1 = fmt & 0xfffff;
    if ((MVar1 - MPP_FMT_YUV422_YUYV < 4) || (MVar1 == MPP_FMT_YUV422SP)) {
      uVar8 = (ulong)(uVar10 * 2);
      sVar4 = fread(buf + uVar9,1,uVar8,(FILE *)fp);
      uVar9 = (uint)sVar4;
      if (uVar10 * 2 != uVar9) {
        pcVar5 = "read 422sp fbc file payload failed %d vs %d\n";
        goto LAB_001044d6;
      }
    }
    else {
      if (MVar1 != MPP_FMT_YUV420SP) {
        _mpp_log_l(2,"utils","not supported fbc format %x\n","read_image",fmt);
        return MPP_OK;
      }
      uVar10 = uVar10 * 3 >> 1;
      uVar8 = (ulong)uVar10;
      sVar4 = fread(buf + uVar9,1,uVar8,(FILE *)fp);
      uVar9 = (uint)sVar4;
      if (uVar10 != uVar9) {
        pcVar5 = "read 420sp fbc file payload failed %d vs %d\n";
LAB_001044d6:
        uVar7 = (ulong)uVar9;
LAB_001044e8:
        _mpp_log_l(2,"utils",pcVar5,"read_image",uVar7,uVar8);
        return MPP_NOK;
      }
    }
    goto LAB_001043d4;
  }
  MVar1 = fmt & 0xfffff;
  uVar9 = MVar1 - MPP_FMT_RGB565;
  if (uVar9 < 0xe) {
    if ((0x3fU >> (uVar9 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar9 & 0x1f) & 1) != 0) {
        pix_w = 4;
        goto LAB_001045e9;
      }
switchD_0010446b_caseD_f:
      pix_w = 3;
      goto LAB_001045e9;
    }
switchD_0010446b_caseD_2:
    pix_w = 2;
LAB_001045e9:
    MVar2 = read_with_pixel_width(buf,width,height,hor_stride,pix_w,fp);
    return MVar2;
  }
  if (MVar1 < MPP_FMT_YUV444SP_10BIT) {
    uVar9 = ver_stride * hor_stride;
    switch(MVar1) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420SP_VU:
      if (height != 0) {
        uVar7 = (ulong)height;
        uVar8 = 0;
        do {
          sVar4 = fread(buf + uVar8,1,(ulong)width,(FILE *)fp);
          if ((RK_U32)sVar4 != width) {
            return MPP_NOK;
          }
          uVar8 = (ulong)((int)uVar8 + hor_stride);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      if (1 < height + 1) {
        uVar11 = width + 1 & 0xfffffffe;
        uVar7 = (ulong)(height + 1 >> 1);
        uVar10 = 0;
        do {
          sVar4 = fread(buf + (ulong)uVar10 + (ulong)uVar9,1,(ulong)uVar11,(FILE *)fp);
          if (uVar11 != (uint)sVar4) {
            return MPP_NOK;
          }
          uVar10 = uVar10 + hor_stride;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV420SP_10BIT:
    case MPP_FMT_YUV422SP_10BIT:
    case MPP_FMT_YUV440SP:
    case MPP_FMT_YUV411SP:
      goto switchD_0010446b_caseD_1;
    default:
      goto switchD_0010446b_caseD_2;
    case MPP_FMT_YUV420P:
      if (height != 0) {
        uVar7 = (ulong)height;
        uVar10 = 0;
        do {
          sVar4 = fread(buf + uVar10,1,(ulong)width,(FILE *)fp);
          if ((RK_U32)sVar4 != width) {
            return MPP_NOK;
          }
          uVar10 = uVar10 + hor_stride;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar11 = height + 1;
      uVar10 = uVar11 >> 1;
      if (1 < uVar11) {
        uVar3 = width + 1 >> 1;
        uVar7 = 0;
        uVar6 = uVar10;
        do {
          sVar4 = fread(buf + (uVar7 >> 1) + (ulong)uVar9,1,(ulong)uVar3,(FILE *)fp);
          if (uVar3 != (uint)sVar4) {
            return MPP_NOK;
          }
          uVar7 = (ulong)((int)uVar7 + hor_stride);
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (1 < uVar11) {
        uVar6 = width + 1 >> 1;
        uVar11 = 0;
        do {
          sVar4 = fread(buf + (ulong)(uVar11 >> 1) + (ulong)(uVar9 >> 2) + (ulong)uVar9,1,
                        (ulong)uVar6,(FILE *)fp);
          if (uVar6 != (uint)sVar4) {
            return MPP_NOK;
          }
          uVar11 = uVar11 + hor_stride;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV400:
      pix_w = 1;
      goto LAB_001045e9;
    case MPP_FMT_YUV444SP:
    case MPP_FMT_YUV444P:
      goto switchD_0010446b_caseD_f;
    }
LAB_001043d4:
    MVar2 = MPP_OK;
  }
  else {
switchD_0010446b_caseD_1:
    _mpp_log_l(2,"utils","read image do not support fmt %d\n","read_image",fmt);
    MVar2 = MPP_ERR_VALUE;
  }
  return MVar2;
}

Assistant:

MPP_RET read_image(RK_U8 *buf, FILE *fp, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt)
{
    MPP_RET ret = MPP_OK;
    RK_U32 read_size;
    RK_U32 row = 0;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_u = buf_y + hor_stride * ver_stride; // NOTE: diff from gen_yuv_image
    RK_U8 *buf_v = buf_u + hor_stride * ver_stride / 4; // NOTE: diff from gen_yuv_image

    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        RK_U32 align_w = MPP_ALIGN(width, 16);
        RK_U32 align_h = MPP_ALIGN(height, 16);
        RK_U32 header_size = 0;

        if ((fmt & MPP_FRAME_FBC_MASK) == MPP_FRAME_FBC_AFBC_V1)
            header_size = MPP_ALIGN(align_w * align_h / 16, SZ_4K);
        else
            header_size = align_w * align_h / 16;

        /* read fbc header first */
        read_size = fread(buf, 1, header_size, fp);
        if (read_size != header_size) {
            mpp_err_f("read fbc file header failed %d vs %d\n",
                      read_size, header_size);
            ret  = MPP_NOK;
            goto err;
        }
        buf += header_size;

        switch (fmt & MPP_FRAME_FMT_MASK) {
        case MPP_FMT_YUV420SP : {
            read_size = fread(buf, 1, align_w * align_h * 3 / 2, fp);
            if (read_size != align_w * align_h * 3 / 2) {
                mpp_err_f("read 420sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 3 / 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY : {
            read_size = fread(buf, 1, align_w * align_h * 2, fp);
            if (read_size != align_w * align_h * 2) {
                mpp_err_f("read 422sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        default : {
            mpp_err_f("not supported fbc format %x\n", fmt);
        } break;
        }

        return MPP_OK;
    }

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP_VU:
    case MPP_FMT_YUV420SP : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        height = MPP_ALIGN(height, 2);
        width = MPP_ALIGN(width, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_YUV420P : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        width = MPP_ALIGN(width, 2);
        height = MPP_ALIGN(height, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_v + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 4, fp);
    } break;
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP :
    case MPP_FMT_YUV422SP_VU:
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 2, fp);
    } break;
    case MPP_FMT_YUV444SP :
    case MPP_FMT_YUV444P :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 3, fp);
    } break;
    case MPP_FMT_YUV400 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 1, fp);
    } break;
    default : {
        mpp_err_f("read image do not support fmt %d\n", fmt);
        ret = MPP_ERR_VALUE;
    } break;
    }

err:

    return ret;
}